

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64assembler.cpp
# Opt level: O0

uint32_t asmjit::_abi_1_10::a64::encodeMovSequence64
                   (uint32_t *out,uint64_t imm,uint32_t rd,uint32_t x)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint in_EDX;
  ulong in_RSI;
  uint *in_RDI;
  uint32_t hwImm_1;
  uint32_t hwIndex_1;
  uint32_t negMask;
  uint32_t count_1;
  uint32_t op_1;
  uint32_t hwImm;
  uint32_t hwIndex;
  uint32_t count;
  uint32_t op;
  uint32_t ohw;
  uint32_t zhw;
  uint32_t kMovK;
  uint32_t kMovN;
  uint32_t kMovZ;
  char *in_stack_000003a0;
  int in_stack_000003ac;
  char *in_stack_000003b0;
  uint32_t in_stack_ffffffffffffffac;
  uint uVar4;
  uint32_t in_stack_ffffffffffffffb0;
  uint uVar5;
  uint32_t in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffbc;
  uint local_40;
  uint local_3c;
  uint local_38;
  ulong local_18;
  uint32_t local_4;
  
  if (0x1f < in_EDX) {
    DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
  }
  if (in_RSI < 0x100000000) {
    local_4 = encodeMovSequence32((uint32_t *)
                                  CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                  in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                                  in_stack_ffffffffffffffac);
  }
  else {
    uVar1 = countZeroHalfWords64(in_RSI);
    uVar2 = countZeroHalfWords64(in_RSI ^ 0xffffffffffffffff);
    local_18 = in_RSI;
    if (uVar1 < uVar2) {
      uVar6 = 0x92800000;
      local_4 = 0;
      uVar5 = 0xffff;
      for (uVar4 = 0; uVar4 < 4; uVar4 = uVar4 + 1) {
        uVar3 = (uint)local_18 & 0xffff;
        if (uVar3 != 0xffff) {
          in_RDI[local_4] = uVar6 | uVar4 << 0x15 | (uVar3 ^ uVar5) << 5 | in_EDX;
          uVar6 = 0xf2800000;
          uVar5 = 0;
          local_4 = local_4 + 1;
        }
        local_18 = local_18 >> 0x10;
      }
      if (local_4 == 0) {
        local_4 = 1;
        *in_RDI = (uVar5 ^ 0xffff) << 5 | 0x92800000 | in_EDX;
      }
    }
    else {
      local_38 = 0xd2800000;
      local_3c = 0;
      for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
        if ((local_18 & 0xffff) != 0) {
          in_RDI[local_3c] = local_38 | local_40 << 0x15 | ((uint)local_18 & 0xffff) << 5 | in_EDX;
          local_38 = 0xf2800000;
          local_3c = local_3c + 1;
        }
        local_18 = local_18 >> 0x10;
      }
      if (local_3c == 0) {
        DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
      }
      local_4 = local_3c;
    }
  }
  return local_4;
}

Assistant:

static uint32_t encodeMovSequence64(uint32_t out[4], uint64_t imm, uint32_t rd, uint32_t x) noexcept {
  ASMJIT_ASSERT(rd <= 31);

  uint32_t kMovZ = 0b11010010100000000000000000000000;
  uint32_t kMovN = 0b10010010100000000000000000000000;
  uint32_t kMovK = 0b11110010100000000000000000000000;

  if (imm <= 0xFFFFFFFFu)
    return encodeMovSequence32(out, uint32_t(imm), rd, x);

  uint32_t zhw = countZeroHalfWords64( imm);
  uint32_t ohw = countZeroHalfWords64(~imm);

  if (zhw >= ohw) {
    uint32_t op = kMovZ;
    uint32_t count = 0;

    for (uint32_t hwIndex = 0; hwIndex < 4; hwIndex++, imm >>= 16) {
      uint32_t hwImm = uint32_t(imm & 0xFFFFu);
      if (hwImm == 0)
        continue;

      out[count++] = op | (hwIndex << 21) | (hwImm << 5) | rd;
      op = kMovK;
    }

    // This should not happen - zero should be handled by encodeMovSequence32().
    ASMJIT_ASSERT(count > 0);

    return count;
  }
  else {
    uint32_t op = kMovN;
    uint32_t count = 0;
    uint32_t negMask = 0xFFFFu;

    for (uint32_t hwIndex = 0; hwIndex < 4; hwIndex++, imm >>= 16) {
      uint32_t hwImm = uint32_t(imm & 0xFFFFu);
      if (hwImm == 0xFFFFu)
        continue;

      out[count++] = op | (hwIndex << 21) | ((hwImm ^ negMask) << 5) | rd;
      op = kMovK;
      negMask = 0;
    }

    if (count == 0) {
      out[count++] = kMovN | ((0xFFFF ^ negMask) << 5) | rd;
    }

    return count;
  }
}